

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

void add_obj_and_parts(Am_Object *orig,Am_Value_List *new_parts,int *maxobjw,int *maxobjh)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Object new_obj;
  Am_Value_List parts;
  Am_Object sub_obj;
  Am_Draw_Method fade_method;
  Am_Draw_Method agg_method;
  Am_Draw_Method method;
  Am_Object local_98;
  Am_Value_List local_90;
  int *local_80;
  Am_Object local_78;
  Am_Value_List *local_70;
  Am_Object local_68;
  Am_Draw_Method local_60;
  Am_Draw_Method local_50;
  Am_Draw_Method local_40;
  
  local_80 = maxobjh;
  local_70 = new_parts;
  pAVar3 = Am_Object::Get(orig,2000,0);
  Am_Draw_Method::Am_Draw_Method(&local_40,pAVar3);
  pAVar3 = Am_Object::Get(&Am_Aggregate,2000,0);
  Am_Draw_Method::Am_Draw_Method(&local_50,pAVar3);
  pAVar3 = Am_Object::Get(&Am_Fade_Group,2000,0);
  Am_Draw_Method::Am_Draw_Method(&local_60,pAVar3);
  local_98.data = (Am_Object_Data *)0x0;
  if ((local_40.from_wrapper != local_50.from_wrapper) &&
     (local_40.from_wrapper != local_60.from_wrapper)) {
    Am_Object::Copy_Value_Only((Am_Object *)&local_90,(char *)orig);
    Am_Object::operator=(&local_98,(Am_Object *)&local_90);
    Am_Object::~Am_Object((Am_Object *)&local_90);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_98);
    Am_Value_List::Add(local_70,pAVar4,Am_TAIL,true);
    pAVar3 = Am_Object::Get(orig,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    if (*maxobjw < iVar2) {
      *maxobjw = iVar2;
    }
    pAVar3 = Am_Object::Get(orig,0x67,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    if (*local_80 < iVar2) {
      *local_80 = iVar2;
    }
  }
  local_78.data = (Am_Object_Data *)0x0;
  bVar1 = Am_Is_Group_Or_Map(orig);
  if (bVar1) {
    bVar1 = Am_Object::Valid(&local_98);
    if (bVar1) {
      Am_Value_List::Am_Value_List(&local_90);
      pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_90);
      Am_Object::Set(&local_98,0x82,pAVar4,0);
      Am_Value_List::~Am_Value_List(&local_90);
    }
    pAVar3 = Am_Object::Get(orig,0x82,0);
    Am_Value_List::Am_Value_List(&local_90,pAVar3);
    Am_Value_List::Start(&local_90);
    while( true ) {
      bVar1 = Am_Value_List::Last(&local_90);
      if (bVar1) break;
      pAVar3 = Am_Value_List::Get(&local_90);
      Am_Object::operator=(&local_78,pAVar3);
      Am_Object::Am_Object(&local_68,&Am_Graphical_Object);
      bVar1 = Am_Object::Is_Instance_Of(&local_78,&local_68);
      Am_Object::~Am_Object(&local_68);
      if (bVar1) {
        add_obj_and_parts(&local_78,local_70,maxobjw,local_80);
      }
      Am_Value_List::Next(&local_90);
    }
    Am_Value_List::~Am_Value_List(&local_90);
  }
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_98);
  return;
}

Assistant:

void
add_obj_and_parts(Am_Object &orig, Am_Value_List &new_parts, int &maxobjw,
                  int &maxobjh)
{
  //don't add parts that use the regular aggregate draw method, since
  //it draws all subparts anyway.  This includes regular Maps and Groups
  Am_Draw_Method method = orig.Get(Am_DRAW_METHOD);
  Am_Draw_Method agg_method = Am_Aggregate.Get(Am_DRAW_METHOD);
  Am_Draw_Method fade_method = Am_Fade_Group.Get(Am_DRAW_METHOD);
  Am_Object new_obj;
  if (method != agg_method && method != fade_method) {
    new_obj = orig.Copy_Value_Only();
    new_parts.Add(new_obj);
    int wh = orig.Get(Am_WIDTH);
    if (wh > maxobjw)
      maxobjw = wh;
    wh = orig.Get(Am_HEIGHT);
    if (wh > maxobjh)
      maxobjh = wh;
  }
  Am_Object sub_obj;
  if (Am_Is_Group_Or_Map(orig)) {
    //flatten out the parts
    //can't use graphical_parts list because it is computed by a
    //constraint which has been removed
    if (new_obj.Valid())
      new_obj.Set(Am_GRAPHICAL_PARTS, Am_Value_List()); //make it empty in copy
    Am_Value_List parts = orig.Get(Am_GRAPHICAL_PARTS);
    for (parts.Start(); !parts.Last(); parts.Next()) {
      sub_obj = parts.Get();
      if (sub_obj.Is_Instance_Of(Am_Graphical_Object))
        add_obj_and_parts(sub_obj, new_parts, maxobjw, maxobjh);
    }
  }
}